

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

NBestEncodeResult * __thiscall
sentencepiece::unigram::Model::NBestEncode
          (NBestEncodeResult *__return_storage_ptr__,Model *this,string_view normalized,
          int nbest_size)

{
  _func_int *p_Var1;
  uint uVar2;
  size_t nbest_size_00;
  _func_int *p_Var3;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *__range3;
  pointer ppVar4;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l;
  initializer_list<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>
  __l_00;
  allocator_type local_109;
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  local_108;
  EncodeResult results;
  Lattice lattice;
  
  (*(this->super_ModelInterface)._vptr_ModelInterface[2])(&lattice);
  if (lattice._vptr_Lattice == (_func_int **)0x0) {
    util::Status::~Status((Status *)&lattice);
    if (normalized._M_len != 0) {
      uVar2 = 0x400;
      if (nbest_size < 0x400) {
        uVar2 = nbest_size;
      }
      nbest_size_00 = 1;
      if (1 < (int)uVar2) {
        nbest_size_00 = (size_t)uVar2;
      }
      if (1 < nbest_size) {
        Lattice::Lattice(&lattice);
        Lattice::SetSentence(&lattice,normalized);
        PopulateNodes(this,&lattice);
        (__return_storage_ptr__->
        super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        Lattice::NBest((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                        *)&local_108,&lattice,nbest_size_00,false,0.0);
        for (ppVar4 = local_108._M_impl.super__Vector_impl_data._M_start;
            ppVar4 != local_108._M_impl.super__Vector_impl_data._M_finish;
            ppVar4 = (pointer)&ppVar4[1].first._M_str) {
          results.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          results.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          results.
          super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var1 = (_func_int *)(ppVar4->first)._M_str;
          for (p_Var3 = (_func_int *)(ppVar4->first)._M_len; p_Var3 != p_Var1; p_Var3 = p_Var3 + 8)
          {
            std::
            vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
            ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
                      ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                        *)&results,*(basic_string_view<char,_std::char_traits<char>_> **)p_Var3,
                       (int *)((long)&(*(basic_string_view<char,_std::char_traits<char>_> **)p_Var3)
                                      [1]._M_str + 4));
          }
          std::
          vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
          ::
          emplace_back<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>&,float_const&>
                    ((vector<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>,std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>,float>>>
                      *)__return_storage_ptr__,
                     (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                      *)&results,(float *)(ppVar4 + 1));
          std::
          _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::~_Vector_base((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                           *)&results);
        }
        std::
        vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
        ::~vector((vector<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>,_std::allocator<std::pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>_>_>
                   *)&local_108);
        Lattice::~Lattice(&lattice);
        return __return_storage_ptr__;
      }
      (*(this->super_ModelInterface)._vptr_ModelInterface[5])
                (&local_108,this,normalized._M_len,normalized._M_str);
      lattice._vptr_Lattice = (_func_int **)local_108._M_impl.super__Vector_impl_data._M_start;
      lattice.sentence_._M_len = (size_t)local_108._M_impl.super__Vector_impl_data._M_finish;
      lattice.sentence_._M_str = (char *)local_108._M_impl.super__Vector_impl_data._M_end_of_storage
      ;
      local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lattice.surface_.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&lattice;
      std::
      vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
      ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&results);
      goto LAB_0022c9db;
    }
  }
  else {
    util::Status::~Status((Status *)&lattice);
  }
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
  ::pair<double,_true>
            ((pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>
              *)&lattice,
             (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)&local_108,(double *)&results);
  __l._M_len = 1;
  __l._M_array = (iterator)&lattice;
  std::
  vector<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>,_std::allocator<std::pair<std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>,_float>_>_>
  ::vector(__return_storage_ptr__,__l,&local_109);
LAB_0022c9db:
  std::
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)&lattice);
  std::
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Vector_base(&local_108);
  return __return_storage_ptr__;
}

Assistant:

NBestEncodeResult Model::NBestEncode(absl::string_view normalized,
                                     int nbest_size) const {
  if (!status().ok() || normalized.empty()) {
    return {{{}, 0.0}};
  }

  nbest_size = std::max<int>(1, std::min<int>(nbest_size, 1024));

  if (nbest_size <= 1) {
    return {std::pair<EncodeResult, float>(Encode(normalized), 0.0)};
  }

  Lattice lattice;
  lattice.SetSentence(normalized);
  PopulateNodes(&lattice);

  NBestEncodeResult nbest_results;
  for (const auto &nbest : lattice.NBest(nbest_size, false, 0.0)) {
    EncodeResult results;
    for (const auto *node : nbest.first) {
      results.emplace_back(node->piece, node->id);
    }
    nbest_results.emplace_back(results, nbest.second);
  }

  return nbest_results;
}